

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

void DoBlending(PalEntry *from,PalEntry *to,int count,int r,int g,int b,int a)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar7;
  
  auVar1 = _DAT_0073b300;
  if (a == 0x100) {
    if (count < 1) {
      return;
    }
    uVar4 = g << 8 | r << 0x10 | b;
    lVar3 = (ulong)(uint)count - 1;
    auVar5._8_4_ = (int)lVar3;
    auVar5._0_8_ = lVar3;
    auVar5._12_4_ = (int)((ulong)lVar3 >> 0x20);
    lVar3 = 0;
    auVar5 = auVar5 ^ _DAT_0073b300;
    auVar6 = _DAT_0073c1a0;
    auVar8 = _DAT_0073b2f0;
    do {
      auVar9 = auVar8 ^ auVar1;
      iVar2 = auVar5._4_4_;
      if ((bool)(~(auVar9._4_4_ == iVar2 && auVar5._0_4_ < auVar9._0_4_ || iVar2 < auVar9._4_4_) & 1
                )) {
        *(uint *)((long)&to->field_0 + lVar3) = uVar4;
      }
      if ((auVar9._12_4_ != auVar5._12_4_ || auVar9._8_4_ <= auVar5._8_4_) &&
          auVar9._12_4_ <= auVar5._12_4_) {
        *(uint *)((long)&to[1].field_0 + lVar3) = uVar4;
      }
      auVar9 = auVar6 ^ auVar1;
      iVar10 = auVar9._4_4_;
      if (iVar10 <= iVar2 && (iVar10 != iVar2 || auVar9._0_4_ <= auVar5._0_4_)) {
        *(uint *)((long)&to[2].field_0 + lVar3) = uVar4;
        *(uint *)((long)&to[3].field_0 + lVar3) = uVar4;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(count + 3U >> 2) << 4 != lVar3);
  }
  else if (a == 0) {
    if (from != to) {
      memcpy(to,from,(long)count << 2);
    }
  }
  else if ((3 < count) && ((CPU.field_6._4_8_ & 0x400000000000000) != 0)) {
    uVar4 = count & 0x7ffffffc;
    DoBlending_SSE2(from,to,uVar4,r,g,b,a);
    count = count & 3;
    if (count == 0) {
      return;
    }
    to = to + uVar4;
    from = from + uVar4;
    goto LAB_005aaacd;
  }
  if (count < 1) {
    return;
  }
LAB_005aaacd:
  iVar2 = 0x100 - a;
  uVar4 = count + 1;
  lVar3 = 2;
  do {
    *(char *)((long)&to->field_0 + lVar3) =
         (char)((uint)*(byte *)((long)&from->field_0 + lVar3) * iVar2 + r * a >> 8);
    *(char *)((long)to + lVar3 + -1) =
         (char)((uint)*(byte *)((long)from + lVar3 + -1) * iVar2 + g * a >> 8);
    *(char *)((long)to + lVar3 + -2) =
         (char)((uint)*(byte *)((long)from + lVar3 + -2) * iVar2 + b * a >> 8);
    lVar3 = lVar3 + 4;
    uVar4 = uVar4 - 1;
  } while (1 < uVar4);
  return;
}

Assistant:

void DoBlending (const PalEntry *from, PalEntry *to, int count, int r, int g, int b, int a)
{
	if (a == 0)
	{
		if (from != to)
		{
			memcpy (to, from, count * sizeof(DWORD));
		}
	}
	else if (a == 256)
	{
		DWORD t = MAKERGB(r,g,b);
		int i;

		for (i = 0; i < count; i++)
		{
			to[i] = t;
		}
	}
#if defined(_M_X64) || defined(_M_IX86) || defined(__i386__) || defined(__amd64__)
	else if (CPU.bSSE2)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_SSE2 (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
#ifdef X86_ASM
	else if (CPU.bMMX)
	{
		if (count >= 4)
		{
			int not3count = count & ~3;
			DoBlending_MMX (from, to, not3count, r, g, b, a);
			count &= 3;
			if (count <= 0)
			{
				return;
			}
			from += not3count;
			to += not3count;
		}
	}
#endif
	int i, ia;

	ia = 256 - a;
	r *= a;
	g *= a;
	b *= a;

	for (i = count; i > 0; i--, to++, from++)
	{
		to->r = (r + from->r * ia) >> 8;
		to->g = (g + from->g * ia) >> 8;
		to->b = (b + from->b * ia) >> 8;
	}
}